

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketManager.cpp
# Opt level: O2

void __thiscall SocketManager::SMMLF::exit_all(SMMLF *this)

{
  server_exit(this);
  client_exit(this);
  return;
}

Assistant:

void SocketManager::SMMLF::exit_all() {
    server_exit();
    client_exit();
}